

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::ComputeShaderGeneratedCase
          (ComputeShaderGeneratedCase *this,Context *context,char *name,char *desc,DrawMethod method
          ,bool computeCmd,bool computeData,bool computeIndices,int gridSize,int drawCallCount)

{
  int iVar1;
  int triangleCount;
  bool computeIndices_local;
  bool computeData_local;
  bool computeCmd_local;
  DrawMethod method_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ComputeShaderGeneratedCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeShaderGeneratedCase_011bcfe8;
  this->m_drawMethod = method;
  this->m_computeCmd = computeCmd;
  this->m_computeData = computeData;
  this->m_computeIndices = computeIndices;
  iVar1 = 0x14;
  if (method == DRAWMETHOD_DRAWARRAYS) {
    iVar1 = 0x10;
  }
  this->m_commandSize = iVar1;
  this->m_numDrawCmds = drawCallCount;
  this->m_gridSize = gridSize;
  this->m_cmdBufferID = 0;
  this->m_dataBufferID = 0;
  this->m_indexBufferID = 0;
  this->m_shaderProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

ComputeShaderGeneratedCase::ComputeShaderGeneratedCase (Context& context, const char* name, const char* desc, DrawMethod method, bool computeCmd, bool computeData, bool computeIndices, int gridSize, int drawCallCount)
	: TestCase			(context, name, desc)
	, m_drawMethod		(method)
	, m_computeCmd		(computeCmd)
	, m_computeData		(computeData)
	, m_computeIndices	(computeIndices)
	, m_commandSize		((method==DRAWMETHOD_DRAWARRAYS) ? ((int)sizeof(DrawArraysCommand)) : ((int)sizeof(DrawElementsCommand)))
	, m_numDrawCmds		(drawCallCount)
	, m_gridSize		(gridSize)
	, m_cmdBufferID		(0)
	, m_dataBufferID	(0)
	, m_indexBufferID	(0)
	, m_shaderProgram	(DE_NULL)
{
    const int triangleCount	= m_gridSize * m_gridSize * 2;

	DE_ASSERT(method < DRAWMETHOD_LAST);
	DE_ASSERT(!computeIndices || method == DRAWMETHOD_DRAWELEMENTS);
	DE_ASSERT(triangleCount % m_numDrawCmds == 0);
	DE_UNREF(triangleCount);
}